

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O3

int WebPRescalerImport(WebPRescaler *rescaler,int num_lines,uint8_t *src,int src_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  rescaler_t *prVar3;
  rescaler_t *prVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  
  if (num_lines < 1) {
    num_lines = 0;
  }
  else {
    iVar6 = 0;
    do {
      if ((rescaler->dst_y < rescaler->dst_height) && (rescaler->y_accum < 1)) {
        return iVar6;
      }
      if (rescaler->y_expand != 0) {
        uVar1 = rescaler->irow;
        uVar2 = rescaler->frow;
        auVar7._8_4_ = (int)uVar1;
        auVar7._0_8_ = uVar2;
        auVar7._12_4_ = (int)((ulong)uVar1 >> 0x20);
        rescaler->irow = (rescaler_t *)uVar2;
        rescaler->frow = (rescaler_t *)auVar7._8_8_;
      }
      WebPRescalerImportRow(rescaler,src);
      if ((rescaler->y_expand == 0) && (0 < rescaler->dst_width * rescaler->num_channels)) {
        prVar3 = rescaler->irow;
        prVar4 = rescaler->frow;
        lVar5 = 0;
        do {
          prVar3[lVar5] = prVar3[lVar5] + prVar4[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 < (long)rescaler->dst_width * (long)rescaler->num_channels);
      }
      rescaler->src_y = rescaler->src_y + 1;
      src = src + src_stride;
      iVar6 = iVar6 + 1;
      rescaler->y_accum = rescaler->y_accum - rescaler->y_sub;
    } while (iVar6 != num_lines);
  }
  return num_lines;
}

Assistant:

int WebPRescalerImport(WebPRescaler* const rescaler, int num_lines,
                       const uint8_t* src, int src_stride) {
  int total_imported = 0;
  while (total_imported < num_lines &&
         !WebPRescalerHasPendingOutput(rescaler)) {
    if (rescaler->y_expand) {
      rescaler_t* const tmp = rescaler->irow;
      rescaler->irow = rescaler->frow;
      rescaler->frow = tmp;
    }
    WebPRescalerImportRow(rescaler, src);
    if (!rescaler->y_expand) {    // Accumulate the contribution of the new row.
      int x;
      for (x = 0; x < rescaler->num_channels * rescaler->dst_width; ++x) {
        rescaler->irow[x] += rescaler->frow[x];
      }
    }
    ++rescaler->src_y;
    src += src_stride;
    ++total_imported;
    rescaler->y_accum -= rescaler->y_sub;
  }
  return total_imported;
}